

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filestream.c
# Opt level: O0

ktx_error_code_e ktxFileStream_skip(ktxStream *str,ktx_size_t count)

{
  int iVar1;
  ulong in_RSI;
  long in_RDI;
  int ret;
  ktx_uint32_t i;
  uint local_1c;
  ktx_error_code_e local_4;
  
  if (in_RDI == 0) {
    local_4 = KTX_INVALID_VALUE;
  }
  else {
    if (*(int *)(in_RDI + 0x38) != 1) {
      __assert_fail("str->type == eStreamTypeFile",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/lib/filestream.c"
                    ,0x7c,"ktx_error_code_e ktxFileStream_skip(ktxStream *, const ktx_size_t)");
    }
    for (local_1c = 0; local_1c < in_RSI; local_1c = local_1c + 1) {
      iVar1 = getc(*(FILE **)(in_RDI + 0x40));
      if (iVar1 == -1) {
        iVar1 = feof(*(FILE **)(in_RDI + 0x40));
        if (iVar1 != 0) {
          return KTX_FILE_UNEXPECTED_EOF;
        }
        return KTX_FILE_READ_ERROR;
      }
    }
    *(ulong *)(in_RDI + 0x58) = in_RSI + *(long *)(in_RDI + 0x58);
    local_4 = KTX_SUCCESS;
  }
  return local_4;
}

Assistant:

static
KTX_error_code ktxFileStream_skip(ktxStream* str, const ktx_size_t count)
{
    if (!str)
        return KTX_INVALID_VALUE;

    assert(str->type == eStreamTypeFile);

    for (ktx_uint32_t i = 0; i < count; i++) {
        int ret = getc(str->data.file);
        if (ret == EOF) {
            if (feof(str->data.file)) {
                return KTX_FILE_UNEXPECTED_EOF;
            } else {
                return KTX_FILE_READ_ERROR;
            }
        }
    }
    str->readpos += count;

    return KTX_SUCCESS;
}